

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QToolBarAreaLayout::takeAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  pointer pQVar4;
  long lVar5;
  ulong i;
  QToolBarAreaLayoutInfo *this_00;
  int iVar6;
  ulong i_00;
  long in_FS_OFFSET;
  QLayoutItem *local_58;
  QToolBarAreaLayoutItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 0;
  do {
    iVar6 = 5;
    if (this->docks[lVar5].lines.d.size != 0) {
      this_00 = this->docks + lVar5;
      i_00 = 0;
      do {
        pQVar4 = QList<QToolBarAreaLayoutLine>::data(&this_00->lines);
        uVar2 = pQVar4[i_00].toolBarItems.d.size;
        bVar3 = uVar2 != 0;
        if (uVar2 == 0) {
LAB_004b8e79:
          iVar6 = 0;
        }
        else {
          iVar1 = *x;
          iVar6 = iVar1 + 1;
          if (index == iVar1) {
            i = 0;
          }
          else {
            i = 0;
            do {
              if (uVar2 - 1 == i) {
                *x = iVar6 + (int)i;
                bVar3 = false;
                goto LAB_004b8e79;
              }
              i = i + 1;
            } while (index - iVar1 != (int)i);
            bVar3 = i < uVar2;
            iVar6 = iVar6 + (int)i;
          }
          *x = iVar6;
          QList<QToolBarAreaLayoutItem>::takeAt(&local_50,&pQVar4[i_00].toolBarItems,i);
          local_58 = local_50.widgetItem;
          iVar6 = 1;
          if (pQVar4[i_00].toolBarItems.d.size == 0) {
            QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,i_00);
          }
        }
        if (bVar3) goto LAB_004b8ea9;
        i_00 = i_00 + 1;
      } while (i_00 < (ulong)(this_00->lines).d.size);
      iVar6 = 5;
    }
LAB_004b8ea9:
    if ((iVar6 != 5) && (iVar6 != 0)) goto LAB_004b8eca;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_58 = (QLayoutItem *)0x0;
LAB_004b8eca:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index) {
                    QLayoutItem *result = line.toolBarItems.takeAt(k).widgetItem;
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return result;
                }
            }
        }
    }

    return nullptr;
}